

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O3

void scp_reply_full_name(SftpReplyBuilder *srb,ptrlen name,ptrlen longname,fxp_attrs attrs)

{
  SftpReplyBuilderVtable *pSVar1;
  
  *(undefined1 *)&srb[-0xf].vt = 0;
  safefree(srb[-6].vt);
  pSVar1 = (SftpReplyBuilderVtable *)mkstr(name);
  srb[-6].vt = pSVar1;
  srb[-5].vt = (SftpReplyBuilderVtable *)name.len;
  srb[-0xd].vt = (SftpReplyBuilderVtable *)attrs.flags;
  srb[-0xc].vt = (SftpReplyBuilderVtable *)attrs.size;
  srb[-0xb].vt = (SftpReplyBuilderVtable *)attrs.uid;
  srb[-10].vt = (SftpReplyBuilderVtable *)attrs.gid;
  srb[-9].vt = (SftpReplyBuilderVtable *)attrs.permissions;
  srb[-8].vt = (SftpReplyBuilderVtable *)attrs.atime;
  srb[-7].vt = (SftpReplyBuilderVtable *)attrs.mtime;
  return;
}

Assistant:

static void scp_reply_full_name(
    SftpReplyBuilder *srb, ptrlen name,
    ptrlen longname, struct fxp_attrs attrs)
{
    ScpReplyReceiver *reply = container_of(srb, ScpReplyReceiver, srb);
    char *p;
    reply->err = false;
    sfree((void *)reply->name.ptr);
    reply->name.ptr = p = mkstr(name);
    reply->name.len = name.len;
    reply->attrs = attrs;
}